

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this,cmFindBaseDebugState *debug)

{
  pointer pbVar1;
  bool bVar2;
  pointer path;
  pointer pbVar3;
  pointer pbVar4;
  string tryPath;
  string local_118;
  pointer local_f8;
  string local_f0;
  string local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  pbVar4 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f8 = (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar4 == local_f8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_b0);
LAB_002ef6f8:
      std::__cxx11::string::~string((string *)&local_118);
      return __return_storage_ptr__;
    }
    pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      local_b0.View_._M_str = (pbVar3->_M_dataplus)._M_p;
      local_b0.View_._M_len = pbVar3->_M_string_length;
      local_80.View_._M_str = (pbVar4->_M_dataplus)._M_p;
      local_80.View_._M_len = pbVar4->_M_string_length;
      cmStrCat<>(&local_50,&local_b0,&local_80);
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = cmsys::SystemTools::FileExists(&local_118);
      if (bVar2) {
        path = pbVar3;
        if (this->IncludeFileInPath != false) {
          path = &local_118;
        }
        bVar2 = cmFindBase::Validate(&this->super_cmFindBase,path);
        if (bVar2) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_local_buf[0] = '\0';
          cmFindBaseDebugState::FoundAt(debug,&local_118,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          if (this->IncludeFileInPath == true) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p == &local_118.field_2) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                            local_118.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_118.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = local_118._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                            local_118.field_2._M_local_buf[0]);
            }
            __return_storage_ptr__->_M_string_length = local_118._M_string_length;
            local_118._M_string_length = 0;
            local_118.field_2._M_local_buf[0] = '\0';
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar3);
          }
          goto LAB_002ef6f8;
        }
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      cmFindBaseDebugState::FailedAt(debug,&local_118,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader(cmFindBaseDebugState& debug)
{
  std::string tryPath;
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      tryPath = cmStrCat(sp, n);
      if (cmSystemTools::FileExists(tryPath) &&
          this->Validate(this->IncludeFileInPath ? tryPath : sp)) {
        debug.FoundAt(tryPath);
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return sp;
      }
      debug.FailedAt(tryPath);
    }
  }
  return "";
}